

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

LocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::macros
          (LocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *this,MacroProps *macros
          )

{
  SymbolsPointerType SVar1;
  PluralRules *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  UNumberSignDisplay UVar6;
  long lVar7;
  Precision *pPVar8;
  Precision *pPVar9;
  byte bVar10;
  
  bVar10 = 0;
  impl::MacroProps::MacroProps((MacroProps *)__return_storage_ptr__,&this->fMacros);
  __return_storage_ptr__->fCompiled = (NumberFormatterImpl *)0x0;
  __return_storage_ptr__->fUnsafeCallCount[0] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[1] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[2] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[3] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[4] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[5] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[6] = '\0';
  __return_storage_ptr__->fUnsafeCallCount[7] = '\0';
  *(undefined8 *)
   &(__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>
    ).fMacros.notation = *(undefined8 *)&macros->notation;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.notation.fUnion.scientific.fExponentSignDisplay =
       (macros->notation).fUnion.scientific.fExponentSignDisplay;
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.unit,
             &macros->unit);
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
              perUnit,&macros->perUnit);
  pPVar8 = &macros->precision;
  pPVar9 = &(__return_storage_ptr__->
            super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
            precision;
  for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar5 = *(undefined4 *)&pPVar8->field_0x4;
    pPVar9->fType = pPVar8->fType;
    *(undefined4 *)&pPVar9->field_0x4 = uVar5;
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    pPVar9 = (Precision *)((long)pPVar9 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.integerWidth.fHasError = (macros->integerWidth).fHasError;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           integerWidth.fUnion + 4) = *(undefined4 *)((long)&(macros->integerWidth).fUnion + 4);
  if (__return_storage_ptr__ != (LocalizedNumberFormatter *)macros) {
    impl::SymbolsWrapper::doCleanup
              (&(__return_storage_ptr__->
                super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
                symbols);
    SVar1 = (macros->symbols).fType;
    (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>
    ).fMacros.symbols.fType = SVar1;
    if (SVar1 - SYMPTR_DFS < 2) {
      (__return_storage_ptr__->
      super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.symbols.fPtr
           = (macros->symbols).fPtr;
      (macros->symbols).fPtr.dfs = (DecimalFormatSymbols *)0x0;
    }
  }
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.decimal = macros->decimal;
  UVar6 = macros->sign;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.unitWidth = macros->unitWidth;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.sign = UVar6;
  Scale::operator=(&(__return_storage_ptr__->
                    super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros
                    .scale,&macros->scale);
  pPVar2 = macros->rules;
  uVar3 = *(undefined8 *)((long)&macros->rules + 4);
  uVar4 = *(undefined8 *)((long)&macros->currencySymbols + 4);
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.affixProvider = macros->affixProvider;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
  fMacros.rules = pPVar2;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.rules +
   4) = uVar3;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           currencySymbols + 4) = uVar4;
  Locale::operator=(&(__return_storage_ptr__->
                     super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                     fMacros.locale,&macros->locale);
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::macros(impl::MacroProps&& macros) const& {
    Derived copy(*this);
    copy.fMacros = std::move(macros);
    return copy;
}